

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# LogManager.cpp
# Opt level: O0

void liblogger::LogManager::Send(LogType Type,string *str)

{
  bool bVar1;
  uint uVar2;
  element_type *peVar3;
  element_type *peVar4;
  undefined8 in_RSI;
  uint in_EDI;
  LogException *ex;
  shared_ptr<liblogger::ILogger> *it_1;
  iterator __end2_1;
  iterator __begin2_1;
  list<std::shared_ptr<liblogger::ILogger>,_std::allocator<std::shared_ptr<liblogger::ILogger>_>_>
  *__range2_1;
  bool filter;
  shared_ptr<liblogger::ILogFilter> *it;
  iterator __end2;
  iterator __begin2;
  list<std::shared_ptr<liblogger::ILogFilter>,_std::allocator<std::shared_ptr<liblogger::ILogFilter>_>_>
  *__range2;
  LogManagerScopedLock lock;
  list<std::shared_ptr<liblogger::ILogFilter>,_std::allocator<std::shared_ptr<liblogger::ILogFilter>_>_>
  *in_stack_ffffffffffffff78;
  undefined7 in_stack_ffffffffffffff80;
  undefined1 in_stack_ffffffffffffff87;
  _Self local_68;
  _Self local_60;
  undefined1 *local_58;
  byte local_39;
  reference local_38;
  _Self local_30;
  _Self local_28;
  undefined1 *local_20;
  undefined4 local_18;
  undefined8 local_10;
  uint local_4;
  
  local_10 = in_RSI;
  local_4 = in_EDI;
  LogManagerScopedLock::LogManagerScopedLock
            ((LogManagerScopedLock *)CONCAT17(in_stack_ffffffffffffff87,in_stack_ffffffffffffff80));
  m_TotalMessages = m_TotalMessages + 1;
  if ((int)local_4 < m_Type) {
    m_TotalDroppedMessages = m_TotalDroppedMessages + 1;
    local_18 = 1;
  }
  else {
    local_20 = m_filters_abi_cxx11_;
    local_28._M_node =
         (_List_node_base *)
         std::__cxx11::
         list<std::shared_ptr<liblogger::ILogFilter>,_std::allocator<std::shared_ptr<liblogger::ILogFilter>_>_>
         ::begin(in_stack_ffffffffffffff78);
    local_30._M_node =
         (_List_node_base *)
         std::__cxx11::
         list<std::shared_ptr<liblogger::ILogFilter>,_std::allocator<std::shared_ptr<liblogger::ILogFilter>_>_>
         ::end(in_stack_ffffffffffffff78);
    while( true ) {
      bVar1 = std::operator!=(&local_28,&local_30);
      if (!bVar1) break;
      local_38 = std::_List_iterator<std::shared_ptr<liblogger::ILogFilter>_>::operator*
                           ((_List_iterator<std::shared_ptr<liblogger::ILogFilter>_> *)0x1a32fc);
      peVar3 = std::
               __shared_ptr_access<liblogger::ILogFilter,_(__gnu_cxx::_Lock_policy)2,_false,_false>
               ::operator->((__shared_ptr_access<liblogger::ILogFilter,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                             *)0x1a330b);
      uVar2 = (*peVar3->_vptr_ILogFilter[2])(peVar3,(ulong)local_4,local_10);
      local_39 = (byte)uVar2 & 1;
      if ((uVar2 & 1) != 0) {
        m_TotalFiltered = m_TotalFiltered + 1;
        local_18 = 1;
        goto LAB_001a34cd;
      }
      std::_List_iterator<std::shared_ptr<liblogger::ILogFilter>_>::operator++(&local_28);
    }
    local_58 = m_loggers_abi_cxx11_;
    local_60._M_node =
         (_List_node_base *)
         std::__cxx11::
         list<std::shared_ptr<liblogger::ILogger>,_std::allocator<std::shared_ptr<liblogger::ILogger>_>_>
         ::begin((list<std::shared_ptr<liblogger::ILogger>,_std::allocator<std::shared_ptr<liblogger::ILogger>_>_>
                  *)in_stack_ffffffffffffff78);
    local_68._M_node =
         (_List_node_base *)
         std::__cxx11::
         list<std::shared_ptr<liblogger::ILogger>,_std::allocator<std::shared_ptr<liblogger::ILogger>_>_>
         ::end((list<std::shared_ptr<liblogger::ILogger>,_std::allocator<std::shared_ptr<liblogger::ILogger>_>_>
                *)in_stack_ffffffffffffff78);
    while( true ) {
      bVar1 = std::operator!=(&local_60,&local_68);
      if (!bVar1) break;
      std::_List_iterator<std::shared_ptr<liblogger::ILogger>_>::operator*
                ((_List_iterator<std::shared_ptr<liblogger::ILogger>_> *)0x1a345a);
      peVar4 = std::
               __shared_ptr_access<liblogger::ILogger,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
               operator->((__shared_ptr_access<liblogger::ILogger,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                           *)0x1a3469);
      (*peVar4->_vptr_ILogger[5])(peVar4,(ulong)local_4,local_10);
      std::_List_iterator<std::shared_ptr<liblogger::ILogger>_>::operator++(&local_60);
    }
    local_18 = 0;
  }
LAB_001a34cd:
  LogManagerScopedLock::~LogManagerScopedLock((LogManagerScopedLock *)0x1a34d7);
  return;
}

Assistant:

void LogManager::Send(const LogType Type, const std::string &str)
{
	LogManagerScopedLock lock = LogManagerScopedLock();

	try
	{
		m_TotalMessages++;
		if (Type < m_Type)
		{
			m_TotalDroppedMessages++;
			return;
		}

		//Filter any messages
		for(auto &it : m_filters) {
			bool filter = it->Filter(Type, str);
			if (filter) {
				m_TotalFiltered++;
				return;
			}
		}

		//Send to all loggers
		for(auto &it : m_loggers) {
			it->Log(Type, str);
		}
	}
	catch(LogException &ex)
	{
		m_TotalErrors++;
		if (m_catcherrors == false)
		{
			throw(ex);
		}
	}
}